

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O3

void aes_sdctr_sw(ssh_cipher *ciph,void *vblk,int blklen)

{
  ssh_cipheralg *psVar1;
  ssh_cipheralg *psVar2;
  ssh_cipheralg *psVar3;
  ssh_cipheralg *psVar4;
  ssh_cipheralg *psVar5;
  ssh_cipheralg *psVar6;
  ssh_cipheralg *psVar7;
  ssh_cipheralg *psVar8;
  ssh_cipheralg *psVar9;
  bool bVar10;
  uint8_t *p_2;
  ulong uVar11;
  ssh_cipher *psVar12;
  ssh_cipheralg *psVar13;
  byte bVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  int iVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint8_t *blk;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ssh_cipher *psVar30;
  uint8_t *p;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  uint8_t *p_1;
  
  if (0 < blklen) {
    psVar1 = (ssh_cipheralg *)(ciph + -9);
    psVar2 = (ssh_cipheralg *)(ciph + -1);
    puVar19 = (ulong *)((long)blklen + (long)vblk);
    psVar13 = ciph[-1].vt;
    do {
      if (psVar13 == psVar2) {
        lVar16 = -0x48;
        do {
          lVar25 = 0;
          bVar10 = true;
          do {
            bVar17 = bVar10;
            psVar13 = ciph[lVar25 + -0xb].vt;
            *(ulong *)((long)&ciph[1 - lVar25].vt + lVar16) =
                 (ulong)psVar13 >> 0x38 | ((ulong)psVar13 & 0xff000000000000) >> 0x28 |
                 ((ulong)psVar13 & 0xff0000000000) >> 0x18 | ((ulong)psVar13 & 0xff00000000) >> 8 |
                 ((ulong)psVar13 & 0xff000000) << 8 | ((ulong)psVar13 & 0xff0000) << 0x18 |
                 ((ulong)psVar13 & 0xff00) << 0x28 | (long)psVar13 << 0x38;
            lVar25 = 1;
            bVar10 = false;
          } while (bVar17);
          uVar20 = 1;
          lVar25 = 0;
          bVar10 = true;
          do {
            bVar17 = bVar10;
            psVar30 = ciph + lVar25 + -0xb;
            psVar13 = psVar30->vt;
            psVar30->vt = (ssh_cipheralg *)((long)&psVar30->vt->new + uVar20);
            uVar20 = (ulong)CARRY8((ulong)psVar13,uVar20);
            lVar25 = 1;
            bVar10 = false;
          } while (bVar17);
          bVar10 = lVar16 < -0x18;
          lVar16 = lVar16 + 0x10;
        } while (bVar10);
        psVar13 = ciph[-9].vt;
        psVar3 = ciph[-8].vt;
        uVar26 = (((ulong)psVar13 >> 7 ^ (ulong)psVar13) & 0xaa00aa00aa00aa) * 0x81 ^ (ulong)psVar13
        ;
        uVar20 = (((ulong)psVar3 >> 7 ^ (ulong)psVar3) & 0xaa00aa00aa00aa) * 0x81 ^ (ulong)psVar3;
        uVar26 = ((uVar26 >> 0xe ^ uVar26) & 0xcccc0000cccc) * 0x4001 ^ uVar26;
        uVar20 = ((uVar20 >> 0xe ^ uVar20) & 0xcccc0000cccc) * 0x4001 ^ uVar20;
        uVar11 = (ulong)(((uint)(uVar26 >> 0x1c) ^ (uint)uVar26) & 0xf0f0f0f0);
        uVar26 = (uVar11 << 0x1c | uVar11) ^ uVar26;
        uVar11 = (ulong)(((uint)(uVar20 >> 0x1c) ^ (uint)uVar20) & 0xf0f0f0f0);
        uVar20 = (uVar11 << 0x1c | uVar11) ^ uVar20;
        uVar11 = (uVar26 >> 8 ^ uVar20) & 0xff00ff00ff00ff;
        uVar26 = uVar11 << 8 ^ uVar26;
        uVar11 = uVar11 ^ uVar20;
        uVar52 = uVar26 & 0xffff;
        uVar33 = uVar26 >> 0x10 & 0xffff;
        uVar27 = uVar26 >> 0x20 & 0xffff;
        uVar26 = uVar26 >> 0x30;
        uVar20 = uVar11 & 0xffff;
        uVar45 = uVar11 >> 0x10 & 0xffff;
        uVar15 = uVar11 >> 0x20 & 0xffff;
        uVar11 = uVar11 >> 0x30;
        lVar16 = 0x10;
        do {
          uVar41 = *(ulong *)((long)&ciph[-9].vt + lVar16);
          uVar37 = *(ulong *)((long)&ciph[-8].vt + lVar16);
          uVar41 = ((uVar41 >> 7 ^ uVar41) & 0xaa00aa00aa00aa) * 0x81 ^ uVar41;
          uVar37 = ((uVar37 >> 7 ^ uVar37) & 0xaa00aa00aa00aa) * 0x81 ^ uVar37;
          uVar41 = ((uVar41 >> 0xe ^ uVar41) & 0xcccc0000cccc) * 0x4001 ^ uVar41;
          uVar37 = ((uVar37 >> 0xe ^ uVar37) & 0xcccc0000cccc) * 0x4001 ^ uVar37;
          uVar21 = (ulong)(((uint)(uVar41 >> 0x1c) ^ (uint)uVar41) & 0xf0f0f0f0);
          uVar41 = (uVar21 << 0x1c | uVar21) ^ uVar41;
          uVar21 = (ulong)(((uint)(uVar37 >> 0x1c) ^ (uint)uVar37) & 0xf0f0f0f0);
          uVar37 = (uVar21 << 0x1c | uVar21) ^ uVar37;
          uVar21 = (uVar41 >> 8 ^ uVar37) & 0xff00ff00ff00ff;
          uVar41 = uVar21 << 8 ^ uVar41;
          uVar21 = uVar21 ^ uVar37;
          bVar14 = (byte)lVar16;
          uVar52 = uVar52 | (uVar41 & 0xffff) << (bVar14 & 0x3f);
          uVar33 = uVar33 | (uVar41 >> 0x10 & 0xffff) << (bVar14 & 0x3f);
          uVar27 = uVar27 | (uVar41 >> 0x20 & 0xffff) << (bVar14 & 0x3f);
          uVar26 = uVar26 | (uVar41 >> 0x30) << (bVar14 & 0x3f);
          uVar20 = uVar20 | (uVar21 & 0xffff) << (bVar14 & 0x3f);
          uVar45 = uVar45 | (uVar21 >> 0x10 & 0xffff) << (bVar14 & 0x3f);
          uVar15 = uVar15 | (uVar21 >> 0x20 & 0xffff) << (bVar14 & 0x3f);
          uVar11 = uVar11 | (uVar21 >> 0x30) << (bVar14 & 0x3f);
          lVar16 = lVar16 + 0x10;
        } while (lVar16 != 0x40);
        uVar52 = uVar52 ^ (ulong)ciph[-0xa2].vt;
        uVar20 = uVar20 ^ (ulong)ciph[-0xa1].vt;
        uVar33 = uVar33 ^ (ulong)ciph[-0xa0].vt;
        uVar45 = uVar45 ^ (ulong)ciph[-0x9f].vt;
        uVar27 = uVar27 ^ (ulong)ciph[-0x9e].vt;
        uVar15 = uVar15 ^ (ulong)ciph[-0x9d].vt;
        uVar26 = uVar26 ^ (ulong)ciph[-0x9c].vt;
        uVar11 = uVar11 ^ (ulong)ciph[-0x9b].vt;
        iVar18 = *(int *)&ciph[-0xc].vt + -1;
        psVar12 = ciph + -0xa2;
        psVar30 = ciph + -0x9a;
        if (iVar18 != 0) {
          do {
            psVar30 = psVar12;
            uVar41 = uVar27 ^ uVar33;
            uVar21 = uVar11 ^ uVar20;
            uVar22 = uVar11 ^ uVar27;
            uVar34 = uVar11 ^ uVar33;
            uVar15 = uVar15 ^ uVar26;
            uVar28 = uVar21 ^ uVar41;
            uVar33 = uVar33 ^ uVar45 ^ uVar28;
            uVar26 = uVar45 ^ uVar28 ^ uVar26;
            uVar38 = uVar33 ^ uVar15;
            uVar45 = uVar26 ^ uVar22;
            uVar37 = uVar38 & uVar34 ^ uVar45 & uVar22;
            uVar29 = (uVar38 ^ uVar45) & uVar41 ^ uVar45 & uVar22;
            uVar23 = uVar15 ^ uVar52;
            uVar20 = uVar20 ^ uVar23;
            uVar15 = uVar15 ^ uVar45;
            uVar46 = uVar26 ^ uVar33 & uVar28 ^ (uVar33 ^ uVar52) & (uVar20 ^ uVar34) ^ uVar29;
            uVar29 = uVar20 & uVar23 ^ uVar15 ^ uVar15 & uVar21 ^ uVar21 ^ uVar29;
            uVar26 = (uVar27 ^ uVar23) & uVar52 ^ uVar34 ^ uVar38 ^ uVar33 & uVar28 ^ uVar37;
            uVar37 = uVar15 & uVar21 ^ uVar11 ^ (uVar45 ^ uVar52) & (uVar23 ^ uVar11) ^ uVar15 ^
                     uVar37;
            uVar31 = uVar29 & uVar46;
            uVar46 = uVar46 ^ uVar26;
            uVar35 = (uVar37 ^ uVar31) & uVar46 ^ uVar26;
            uVar42 = (uVar26 ^ uVar31) & (uVar37 ^ uVar29);
            uVar26 = uVar42 ^ uVar37;
            uVar42 = (uVar42 ^ uVar31) & uVar37;
            uVar29 = uVar29 ^ uVar42;
            uVar46 = (uVar42 ^ uVar37 ^ uVar31) & uVar35 ^ uVar46;
            uVar47 = uVar29 ^ uVar26;
            uVar31 = uVar35 ^ uVar26;
            uVar32 = uVar46 ^ uVar47;
            uVar48 = uVar47 & (uVar20 ^ uVar34);
            uVar42 = (uVar45 ^ uVar52) & uVar35;
            uVar15 = uVar15 & (uVar46 ^ uVar35);
            uVar21 = (uVar46 ^ uVar35) & uVar21;
            uVar37 = uVar33 & uVar29 ^ uVar15;
            uVar39 = (uVar38 ^ uVar45) & (uVar32 ^ uVar31);
            uVar41 = (uVar32 ^ uVar31) & uVar41;
            uVar43 = uVar46 & uVar20 ^ uVar42;
            uVar20 = uVar45 & uVar31 ^ uVar15 ^ uVar39;
            uVar15 = uVar21 ^ uVar52 & uVar26 ^ uVar37;
            uVar24 = uVar31 & uVar22 ^ uVar41;
            uVar53 = uVar15 ^ uVar43 ^ uVar24;
            uVar24 = uVar24 ^ uVar23 & uVar46;
            uVar50 = uVar38 & uVar32 ^ uVar39 ^ uVar24;
            uVar24 = uVar24 ^ uVar48 ^ uVar29 & uVar28;
            uVar22 = uVar23 & uVar46 ^ uVar20;
            uVar36 = uVar35 & (uVar23 ^ uVar11) ^ uVar15 ^ uVar50;
            uVar40 = (uVar33 ^ uVar52) & uVar47 ^ uVar24;
            uVar24 = uVar24 ^ uVar20;
            uVar50 = uVar50 ^ uVar21 ^ uVar43;
            uVar37 = uVar37 ^ uVar40;
            uVar40 = uVar40 ^ uVar42 ^ uVar52 & uVar26;
            uVar42 = uVar26 & (uVar27 ^ uVar23) ^ uVar48 ^ uVar36;
            uVar36 = uVar32 & uVar34 ^ uVar41 ^ uVar22 ^ uVar36;
            uVar22 = uVar37 ^ uVar22;
            uVar41 = ((uVar53 >> 8 ^ uVar53) & 0xcc00cc00cc00cc) * 0x101 ^ uVar53;
            uVar20 = uVar41 >> 4 & 0xaaa0aaa0aaa0aaa;
            uVar27 = (uVar41 & 0xa000a000a000a) << 0xc;
            uVar45 = ((uVar50 >> 8 ^ uVar50) & 0xcc00cc00cc00cc) * 0x101 ^ uVar50;
            uVar11 = uVar45 >> 4 & 0xaaa0aaa0aaa0aaa;
            uVar21 = (uVar45 & 0xa000a000a000a) << 0xc;
            uVar51 = ((uVar42 >> 8 ^ uVar42) & 0xcc00cc00cc00cc) * 0x101 ^ uVar42;
            uVar23 = (uVar51 & 0xa000a000a000a) << 0xc;
            uVar34 = uVar51 >> 4 & 0xaaa0aaa0aaa0aaa;
            uVar44 = ((uVar40 >> 8 ^ uVar40) & 0xcc00cc00cc00cc) * 0x101 ^ uVar40;
            uVar31 = (uVar44 & 0xa000a000a000a) << 0xc;
            uVar26 = uVar44 >> 4 & 0xaaa0aaa0aaa0aaa;
            uVar35 = ((uVar37 >> 8 ^ uVar37) & 0xcc00cc00cc00cc) * 0x101 ^ uVar37;
            uVar28 = (uVar35 & 0xa000a000a000a) << 0xc;
            uVar29 = ((uVar36 >> 8 ^ uVar36) & 0xcc00cc00cc00cc) * 0x101 ^ uVar36;
            uVar38 = (uVar29 & 0xa000a000a000a) << 0xc;
            uVar15 = uVar35 >> 4 & 0xaaa0aaa0aaa0aaa;
            uVar43 = uVar29 >> 4 & 0xaaa0aaa0aaa0aaa;
            uVar48 = ((uVar22 >> 8 ^ uVar22) & 0xcc00cc00cc00cc) * 0x101 ^ uVar22;
            uVar52 = (uVar48 & 0xa000a000a000a) << 0xc;
            uVar39 = uVar48 >> 4 & 0xaaa0aaa0aaa0aaa;
            uVar46 = ((uVar24 >> 8 ^ uVar24) & 0xcc00cc00cc00cc) * 0x101 ^ uVar24;
            uVar33 = (uVar46 & 0xa000a000a000a) << 0xc;
            uVar47 = uVar46 >> 4 & 0xaaa0aaa0aaa0aaa;
            uVar53 = (uVar41 & 0x4444444444444444 | uVar27 | uVar20) >> 1 |
                     (uVar53 & 0x1111111111111111) << 3;
            uVar32 = (uVar45 & 0x4444444444444444 | uVar21 | uVar11) >> 1 |
                     (uVar50 & 0x1111111111111111) << 3;
            uVar50 = (uVar51 & 0x4444444444444444 | uVar23 | uVar34) >> 1 |
                     (uVar42 & 0x1111111111111111) << 3;
            uVar40 = (uVar44 & 0x4444444444444444 | uVar31 | uVar26) >> 1 |
                     (uVar40 & 0x1111111111111111) << 3;
            uVar49 = (uVar35 & 0x4444444444444444 | uVar28 | uVar15) >> 1 |
                     (uVar37 & 0x1111111111111111) << 3;
            uVar37 = (uVar29 & 0x4444444444444444 | uVar38 | uVar43) >> 1 |
                     (uVar36 & 0x1111111111111111) << 3;
            uVar22 = (uVar48 & 0x4444444444444444 | uVar52 | uVar39) >> 1 |
                     (uVar22 & 0x1111111111111111) << 3;
            uVar42 = (uVar46 & 0x4444444444444444 | uVar33 | uVar47) >> 1 |
                     (uVar24 & 0x1111111111111111) << 3;
            uVar20 = (uVar41 & 0x5555555555555555 | uVar27 | uVar20) ^ uVar53;
            uVar11 = (uVar45 & 0x5555555555555555 | uVar21 | uVar11) ^ uVar32;
            uVar45 = (uVar51 & 0x5555555555555555 | uVar23 | uVar34) ^ uVar50;
            uVar41 = (uVar46 & 0x5555555555555555 | uVar33 | uVar47) ^ uVar42;
            uVar27 = (uVar44 & 0x5555555555555555 | uVar31 | uVar26) ^ uVar40;
            uVar15 = (uVar35 & 0x5555555555555555 | uVar28 | uVar15) ^ uVar49;
            uVar26 = (uVar29 & 0x5555555555555555 | uVar38 | uVar43) ^ uVar37;
            uVar21 = (uVar48 & 0x5555555555555555 | uVar52 | uVar39) ^ uVar22;
            uVar52 = uVar53 ^ uVar41 ^
                     (uVar20 >> 2 & 0x3333333333333333 | uVar20 * 4 & 0xcccccccccccccccc) ^
                     (ulong)psVar30[8].vt;
            uVar20 = uVar32 ^ uVar20 ^ uVar41 ^
                     (uVar11 >> 2 & 0x3333333333333333 | uVar11 * 4 & 0xcccccccccccccccc) ^
                     (ulong)psVar30[9].vt;
            uVar33 = uVar50 ^ uVar11 ^
                     (uVar45 >> 2 & 0x3333333333333333 | uVar45 * 4 & 0xcccccccccccccccc) ^
                     (ulong)psVar30[10].vt;
            uVar45 = uVar40 ^ uVar41 ^ uVar45 ^
                     (uVar27 >> 2 & 0x3333333333333333 | uVar27 * 4 & 0xcccccccccccccccc) ^
                     (ulong)psVar30[0xb].vt;
            uVar27 = uVar41 ^ uVar49 ^ uVar27 ^
                     (uVar15 >> 2 & 0x3333333333333333 | uVar15 * 4 & 0xcccccccccccccccc) ^
                     (ulong)psVar30[0xc].vt;
            uVar15 = uVar37 ^ uVar15 ^
                     (uVar26 >> 2 & 0x3333333333333333 | uVar26 * 4 & 0xcccccccccccccccc) ^
                     (ulong)psVar30[0xd].vt;
            uVar26 = uVar22 ^ uVar26 ^
                     (uVar21 >> 2 & 0x3333333333333333 | uVar21 * 4 & 0xcccccccccccccccc) ^
                     (ulong)psVar30[0xe].vt;
            uVar11 = uVar42 ^ uVar21 ^
                     (uVar41 >> 2 & 0x3333333333333333 | uVar41 * 4 & 0xcccccccccccccccc) ^
                     (ulong)psVar30[0xf].vt;
            psVar12 = psVar30 + 8;
            iVar18 = iVar18 + -1;
          } while (iVar18 != 0);
          psVar30 = psVar30 + 0x10;
        }
        uVar37 = uVar33 ^ uVar27;
        uVar24 = uVar20 ^ uVar11;
        uVar41 = uVar33 ^ uVar11;
        uVar15 = uVar15 ^ uVar26;
        uVar22 = uVar52 ^ uVar15;
        uVar43 = uVar24 ^ uVar37;
        uVar33 = uVar33 ^ uVar45 ^ uVar43;
        uVar26 = uVar45 ^ uVar43 ^ uVar26;
        uVar29 = uVar27 ^ uVar11;
        uVar34 = uVar33 ^ uVar15;
        uVar31 = uVar26 ^ uVar29;
        uVar21 = (uVar34 ^ uVar31) & uVar37 ^ uVar31 & uVar29;
        uVar45 = uVar34 & uVar41 ^ uVar31 & uVar29;
        uVar20 = uVar20 ^ uVar22;
        uVar15 = uVar15 ^ uVar31;
        uVar38 = uVar26 ^ uVar33 & uVar43 ^ (uVar33 ^ uVar52) & (uVar20 ^ uVar41) ^ uVar21;
        uVar21 = uVar20 & uVar22 ^ uVar15 ^ uVar15 & uVar24 ^ uVar24 ^ uVar21;
        uVar23 = (uVar22 ^ uVar27) & uVar52 ^ uVar41 ^ uVar34 ^ uVar33 & uVar43 ^ uVar45;
        uVar45 = uVar15 & uVar24 ^ uVar11 ^ (uVar31 ^ uVar52) & (uVar22 ^ uVar11) ^ uVar15 ^ uVar45;
        uVar26 = uVar21 & uVar38;
        uVar38 = uVar38 ^ uVar23;
        uVar42 = (uVar45 ^ uVar26) & uVar38 ^ uVar23;
        uVar28 = (uVar23 ^ uVar26) & (uVar45 ^ uVar21);
        uVar23 = uVar28 ^ uVar45;
        uVar28 = (uVar28 ^ uVar26) & uVar45;
        uVar21 = uVar21 ^ uVar28;
        uVar38 = (uVar28 ^ uVar45 ^ uVar26) & uVar42 ^ uVar38;
        uVar39 = uVar21 ^ uVar23;
        uVar35 = uVar38 ^ uVar39;
        uVar46 = uVar39 & (uVar20 ^ uVar41);
        uVar26 = uVar42 ^ uVar23;
        uVar15 = uVar15 & (uVar38 ^ uVar42);
        uVar24 = (uVar38 ^ uVar42) & uVar24;
        uVar32 = (uVar31 ^ uVar52) & uVar42;
        uVar45 = (uVar34 ^ uVar31) & (uVar35 ^ uVar26);
        uVar37 = (uVar35 ^ uVar26) & uVar37;
        uVar47 = uVar38 & uVar20 ^ uVar32;
        uVar28 = uVar33 & uVar21 ^ uVar15;
        uVar20 = uVar31 & uVar26 ^ uVar15 ^ uVar45;
        uVar31 = uVar24 ^ uVar52 & uVar23 ^ uVar28;
        uVar26 = uVar26 & uVar29 ^ uVar37;
        uVar29 = uVar31 ^ uVar47 ^ uVar26;
        uVar26 = uVar26 ^ uVar22 & uVar38;
        uVar34 = uVar34 & uVar35 ^ uVar45 ^ uVar26;
        uVar26 = uVar26 ^ uVar46 ^ uVar21 & uVar43;
        uVar15 = uVar22 & uVar38 ^ uVar20;
        uVar33 = (uVar33 ^ uVar52) & uVar39 ^ uVar26;
        uVar26 = uVar26 ^ uVar20;
        uVar45 = uVar42 & (uVar22 ^ uVar11) ^ uVar31 ^ uVar34;
        uVar34 = uVar34 ^ uVar24 ^ uVar47;
        uVar28 = uVar28 ^ uVar33;
        uVar33 = uVar33 ^ uVar32 ^ uVar52 & uVar23;
        uVar11 = uVar23 & (uVar22 ^ uVar27) ^ uVar46 ^ uVar45;
        uVar20 = uVar28 ^ uVar15;
        uVar45 = uVar35 & uVar41 ^ uVar37 ^ uVar15 ^ uVar45;
        uVar29 = ((uVar29 >> 8 ^ uVar29) & 0xcc00cc00cc00cc) * 0x101 ^ uVar29;
        psVar13 = psVar30->vt;
        uVar34 = ((uVar34 >> 8 ^ uVar34) & 0xcc00cc00cc00cc) * 0x101 ^ uVar34;
        uVar11 = ((uVar11 >> 8 ^ uVar11) & 0xcc00cc00cc00cc) * 0x101 ^ uVar11;
        uVar33 = ((uVar33 >> 8 ^ uVar33) & 0xcc00cc00cc00cc) * 0x101 ^ uVar33;
        uVar28 = ((uVar28 >> 8 ^ uVar28) & 0xcc00cc00cc00cc) * 0x101 ^ uVar28;
        uVar45 = ((uVar45 >> 8 ^ uVar45) & 0xcc00cc00cc00cc) * 0x101 ^ uVar45;
        uVar20 = ((uVar20 >> 8 ^ uVar20) & 0xcc00cc00cc00cc) * 0x101 ^ uVar20;
        uVar26 = ((uVar26 >> 8 ^ uVar26) & 0xcc00cc00cc00cc) * 0x101 ^ uVar26;
        psVar3 = psVar12[9].vt;
        psVar4 = psVar12[10].vt;
        psVar5 = psVar12[0xb].vt;
        psVar6 = psVar12[0xc].vt;
        psVar7 = psVar12[0xd].vt;
        psVar8 = psVar12[0xe].vt;
        psVar9 = psVar12[0xf].vt;
        lVar16 = 0;
        do {
          bVar14 = (byte)lVar16;
          uVar15 = ((uVar34 & 0x5555555555555555 | (uVar34 & 0xa000a000a000a) << 0xc |
                    uVar34 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar3) >> (bVar14 & 0x3f) & 0xffff |
                   (ulong)(uint)((int)(((uVar33 & 0x5555555555555555 |
                                         (uVar33 & 0xa000a000a000a) << 0xc |
                                        uVar33 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar5) >>
                                      (bVar14 & 0x3f)) << 0x10) |
                   (((uVar45 & 0x5555555555555555 | (uVar45 & 0xa000a000a000a) << 0xc |
                     uVar45 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar7) >> (bVar14 & 0x3f) & 0xffff)
                   << 0x20 | (((uVar26 & 0x5555555555555555 | (uVar26 & 0xa000a000a000a) << 0xc |
                               uVar26 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar9) >> (bVar14 & 0x3f))
                             << 0x30;
          uVar52 = ((uVar29 & 0x5555555555555555 | (uVar29 & 0xa000a000a000a) << 0xc |
                    uVar29 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar13) >> (bVar14 & 0x3f) & 0xffff |
                   (ulong)(uint)((int)(((uVar11 & 0x5555555555555555 |
                                         (uVar11 & 0xa000a000a000a) << 0xc |
                                        uVar11 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar4) >>
                                      (bVar14 & 0x3f)) << 0x10) |
                   (((uVar28 & 0x5555555555555555 | (uVar28 & 0xa000a000a000a) << 0xc |
                     uVar28 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar6) >> (bVar14 & 0x3f) & 0xffff)
                   << 0x20 | (((uVar20 & 0x5555555555555555 | (uVar20 & 0xa000a000a000a) << 0xc |
                               uVar20 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar8) >> (bVar14 & 0x3f))
                             << 0x30;
          uVar27 = (uVar52 >> 8 ^ uVar15) & 0xff00ff00ff00ff;
          uVar52 = uVar27 << 8 ^ uVar52;
          uVar27 = uVar27 ^ uVar15;
          uVar15 = (ulong)(((uint)(uVar52 >> 0x1c) ^ (uint)uVar52) & 0xf0f0f0f0);
          uVar52 = (uVar15 << 0x1c | uVar15) ^ uVar52;
          uVar15 = (ulong)(((uint)(uVar27 >> 0x1c) ^ (uint)uVar27) & 0xf0f0f0f0);
          uVar27 = (uVar15 << 0x1c | uVar15) ^ uVar27;
          uVar52 = ((uVar52 >> 0xe ^ uVar52) & 0xcccc0000cccc) * 0x4001 ^ uVar52;
          uVar27 = ((uVar27 >> 0xe ^ uVar27) & 0xcccc0000cccc) * 0x4001 ^ uVar27;
          uVar52 = ((uVar52 >> 7 ^ uVar52) & 0xaa00aa00aa00aa) * 0x81 ^ uVar52;
          uVar27 = ((uVar27 >> 7 ^ uVar27) & 0xaa00aa00aa00aa) * 0x81 ^ uVar27;
          *(char *)((long)&psVar1->new + lVar16) = (char)uVar52;
          *(char *)((long)ciph + lVar16 + -0x47) = (char)(uVar52 >> 8);
          *(char *)((long)ciph + lVar16 + -0x46) = (char)(uVar52 >> 0x10);
          *(char *)((long)ciph + lVar16 + -0x45) = (char)(uVar52 >> 0x18);
          *(char *)((long)ciph + lVar16 + -0x44) = (char)(uVar52 >> 0x20);
          *(char *)((long)ciph + lVar16 + -0x43) = (char)(uVar52 >> 0x28);
          *(char *)((long)ciph + lVar16 + -0x42) = (char)(uVar52 >> 0x30);
          *(char *)((long)ciph + lVar16 + -0x41) = (char)(uVar52 >> 0x38);
          *(char *)((long)&ciph[-8].vt + lVar16) = (char)uVar27;
          *(char *)((long)ciph + lVar16 + -0x3f) = (char)(uVar27 >> 8);
          *(char *)((long)ciph + lVar16 + -0x3e) = (char)(uVar27 >> 0x10);
          *(char *)((long)ciph + lVar16 + -0x3d) = (char)(uVar27 >> 0x18);
          *(char *)((long)ciph + lVar16 + -0x3c) = (char)(uVar27 >> 0x20);
          *(char *)((long)ciph + lVar16 + -0x3b) = (char)(uVar27 >> 0x28);
          *(char *)((long)ciph + lVar16 + -0x3a) = (char)(uVar27 >> 0x30);
          *(char *)((long)ciph + lVar16 + -0x39) = (char)(uVar27 >> 0x38);
          lVar16 = lVar16 + 0x10;
        } while (lVar16 != 0x40);
        psVar2->new = (_func_ssh_cipher_ptr_ssh_cipheralg_ptr *)psVar1;
        psVar13 = psVar1;
      }
      *(ulong *)vblk = *vblk ^ (ulong)psVar13->new;
      *(ulong *)((long)vblk + 8) = *(ulong *)((long)vblk + 8) ^ (ulong)psVar13->free;
      psVar13 = (ssh_cipheralg *)&((ssh_cipheralg *)psVar2->new)->setiv;
      psVar2->new = (_func_ssh_cipher_ptr_ssh_cipheralg_ptr *)psVar13;
      vblk = (void *)((long)vblk + 0x10);
    } while (vblk < puVar19);
  }
  return;
}

Assistant:

static inline void aes_sdctr_sw(
    ssh_cipher *ciph, void *vblk, int blklen)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);

    /*
     * SDCTR encrypt/decrypt loops round one block at a time XORing
     * the keystream into the user's data, and periodically has to run
     * a parallel encryption operation to get more keystream.
     */

    uint8_t *keystream_end =
        ctx->iv.sdctr.keystream + sizeof(ctx->iv.sdctr.keystream);

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {

        if (ctx->iv.sdctr.keystream_pos == keystream_end) {
            /*
             * Generate some keystream.
             */
            for (uint8_t *block = ctx->iv.sdctr.keystream;
                 block < keystream_end; block += 16) {
                /* Format the counter value into the buffer. */
                for (unsigned i = 0; i < SDCTR_WORDS; i++)
                    PUT_BIGNUMINT_MSB_FIRST(
                        block + 16 - BIGNUM_INT_BYTES - i*BIGNUM_INT_BYTES,
                        ctx->iv.sdctr.counter[i]);

                /* Increment the counter. */
                BignumCarry carry = 1;
                for (unsigned i = 0; i < SDCTR_WORDS; i++)
                    BignumADC(ctx->iv.sdctr.counter[i], carry,
                              ctx->iv.sdctr.counter[i], 0, carry);
            }

            /* Encrypt all those counter blocks. */
            aes_sliced_e_parallel(ctx->iv.sdctr.keystream,
                                  ctx->iv.sdctr.keystream, &ctx->sk);

            /* Reset keystream_pos to the start of the buffer. */
            ctx->iv.sdctr.keystream_pos = ctx->iv.sdctr.keystream;
        }

        memxor16(blk, blk, ctx->iv.sdctr.keystream_pos);
        ctx->iv.sdctr.keystream_pos += 16;
    }
}